

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readDeepScanLine<Imf_3_2::DeepScanLineInputFile>
               (DeepScanLineInputFile *in,bool reduceMemory,bool reduceTime)

{
  undefined1 uVar1;
  bool bVar2;
  Header *pHVar3;
  Array<Imf_3_2::Array<void_*>_> *this;
  uint *puVar4;
  DeepSlice *pDVar5;
  Array<void_*> *pAVar6;
  void **ppvVar7;
  byte in_DL;
  byte in_SIL;
  DeepFrameBuffer *in_RDI;
  int k_1;
  uint64_t j_1;
  size_t bufferIndex;
  int k;
  uint64_t j;
  size_t fileBufferSize;
  size_t bufferSize;
  int y;
  vector<float,_std::allocator<float>_> pixelBuffer;
  int step;
  int pointerSize;
  int sampleSize;
  PixelType type;
  ConstIterator i_2;
  int channel;
  DeepFrameBuffer frameBuffer;
  int i_1;
  Array<Imf_3_2::Array<void_*>_> data;
  Array<unsigned_int> localSampleCount;
  ConstIterator i;
  int channelCount;
  uint64_t bytesPerSample;
  int dwx;
  uint64_t w;
  Box2i *dw;
  Header *fileHeader;
  bool threw;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  reference in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  PixelType in_stack_fffffffffffffd94;
  undefined7 in_stack_fffffffffffffdc8;
  int local_1ec;
  ulong local_1e8;
  size_type local_1e0;
  int local_1d4;
  ulong local_1d0;
  long local_1c8;
  long local_1c0;
  int local_1b4;
  vector<float,_std::allocator<float>_> local_1b0;
  int local_194;
  DeepSlice local_190 [60];
  int local_154;
  int local_150;
  PixelType local_14c;
  undefined8 local_148;
  undefined8 local_140;
  int local_134;
  Slice local_130 [56];
  Slice local_f8 [108];
  int local_8c;
  Array local_88 [16];
  Array<unsigned_int> local_78;
  Array<Imf_3_2::Array<void_*>_> *local_68;
  undefined8 local_60;
  int local_54;
  long local_50;
  int local_44;
  ulong local_40;
  int *local_38;
  undefined8 local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  DeepFrameBuffer *local_10;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = 0;
  local_10 = in_RDI;
  local_20 = Imf_3_2::DeepScanLineInputFile::header();
  local_38 = (int *)Imf_3_2::Header::dataWindow();
  local_40 = ((long)local_38[2] - (long)*local_38) + 1;
  local_44 = *local_38;
  pHVar3 = (Header *)Imf_3_2::DeepScanLineInputFile::header();
  local_50 = Imf_3_2::calculateBytesPerPixel(pHVar3);
  if (((local_11 & 1) == 0) || (local_40 << 2 < 0x7a1201)) {
    local_54 = 0;
    Imf_3_2::Header::channels();
    local_60 = Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      this = (Array<Imf_3_2::Array<void_*>_> *)Imf_3_2::ChannelList::end();
      local_68 = this;
      uVar1 = operator!=((ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         (ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (!(bool)uVar1) break;
      ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      local_54 = local_54 + 1;
    }
    Array<unsigned_int>::Array(&local_78);
    Array<unsigned_int>::resizeErase
              ((Array<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    Array<Imf_3_2::Array<void_*>_>::Array(this,CONCAT17(uVar1,in_stack_fffffffffffffdc8));
    for (local_8c = 0; local_8c < local_54; local_8c = local_8c + 1) {
      Array::operator_cast_to_Array_(local_88);
      Array<void_*>::resizeErase
                ((Array<void_*> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    }
    DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78);
    uVar9 = 0;
    uVar8 = 1;
    Imf_3_2::Slice::Slice(local_130,UINT,(char *)(puVar4 + -local_44),4,0,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_f8);
    local_134 = 0;
    Imf_3_2::Header::channels();
    local_140 = Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      local_148 = Imf_3_2::ChannelList::end();
      bVar2 = operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffd74,uVar9),
                         (ConstIterator *)CONCAT44(in_stack_fffffffffffffd6c,uVar8));
      if (!bVar2) break;
      local_14c = FLOAT;
      local_150 = 4;
      local_154 = 8;
      pDVar5 = (DeepSlice *)ChannelList::ConstIterator::name((ConstIterator *)0x11a2d7);
      in_stack_fffffffffffffd94 = local_14c;
      pAVar6 = Array::operator_cast_to_Array_(local_88);
      ppvVar7 = Array::operator_cast_to_void__((Array *)(pAVar6 + local_134));
      in_stack_fffffffffffffd80 = 0;
      uVar9 = 1;
      uVar8 = 1;
      Imf_3_2::DeepSlice::DeepSlice
                (local_190,in_stack_fffffffffffffd94,(char *)(ppvVar7 + -local_44),(long)local_154,0
                 ,(long)local_150,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((char *)local_f8,pDVar5);
      ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd74,uVar9));
      local_134 = local_134 + 1;
    }
    Imf_3_2::DeepScanLineInputFile::setFrameBuffer(local_10);
    local_194 = 1;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x11a3ef);
    for (local_1b4 = local_38[1]; local_1b4 <= local_38[3]; local_1b4 = local_194 + local_1b4) {
      Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)local_10);
      local_1c0 = 0;
      local_1c8 = 0;
      for (local_1d0 = 0; local_1d0 < local_40; local_1d0 = local_1d0 + 1) {
        for (local_1d4 = 0; local_1d4 < local_54; local_1d4 = local_1d4 + 1) {
          puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78);
          local_1c8 = (ulong)puVar4[local_1d0] + local_1c8;
          if (((local_11 & 1) == 0) ||
             (puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78),
             (ulong)puVar4[local_1d0] * local_50 < 0x3e9)) {
            puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78);
            local_1c0 = (ulong)puVar4[local_1d0] + local_1c0;
          }
        }
      }
      if (((local_11 & 1) == 0) || ((ulong)(local_1c8 + local_1c0) < 0x1000)) {
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (size_type)in_stack_fffffffffffffd88);
        local_1e0 = 0;
        for (local_1e8 = 0; local_1e8 < local_40; local_1e8 = local_1e8 + 1) {
          for (local_1ec = 0; local_1ec < local_54; local_1ec = local_1ec + 1) {
            puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78);
            if ((puVar4[local_1e8] == 0) ||
               (((local_11 & 1) != 0 &&
                (puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78),
                1000 < (ulong)puVar4[local_1e8] * local_50)))) {
              pAVar6 = Array::operator_cast_to_Array_(local_88);
              ppvVar7 = Array::operator_cast_to_void__((Array *)(pAVar6 + local_1ec));
              ppvVar7[local_1e8] = (void *)0x0;
            }
            else {
              in_stack_fffffffffffffd88 =
                   std::vector<float,_std::allocator<float>_>::operator[](&local_1b0,local_1e0);
              pAVar6 = Array::operator_cast_to_Array_(local_88);
              ppvVar7 = Array::operator_cast_to_void__((Array *)(pAVar6 + local_1ec));
              ppvVar7[local_1e8] = in_stack_fffffffffffffd88;
              puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&local_78);
              local_1e0 = puVar4[local_1e8] + local_1e0;
            }
          }
        }
        Imf_3_2::DeepScanLineInputFile::readPixels((int)local_10);
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x11a7ea);
    Array<Imf_3_2::Array<void_*>_>::~Array
              ((Array<Imf_3_2::Array<void_*>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    Array<unsigned_int>::~Array((Array<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd74,uVar9));
    local_1 = (bool)(local_13 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
readDeepScanLine (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();
        const Box2i&  dw         = fileHeader.dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx = dw.min.x;

        uint64_t bytesPerSample = calculateBytesPerPixel (in.header ());

        //
        // in reduce memory mode, check size required by sampleCount table
        //
        if (reduceMemory && w * 4 > gMaxBytesPerScanline) { return false; }

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channelCount)
            ;

        Array<unsigned int> localSampleCount;
        localSampleCount.resizeErase (w);
        Array<Array<void*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (w);
        }

        DeepFrameBuffer frameBuffer;

        frameBuffer.insertSampleCountSlice (Slice (
            UINT, (char*) (&localSampleCount[-dwx]), sizeof (unsigned int), 0));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            PixelType type = FLOAT;

            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    type,
                    (char*) (&data[channel][-dwx]),
                    pointerSize,
                    0,
                    sampleSize));
        }

        in.setFrameBuffer (frameBuffer);

        int step = 1;

        vector<float> pixelBuffer;

        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            in.readPixelSampleCounts (y);

            //
            // count how many samples are required to store this scanline
            // in reduceMemory mode, pixels with large sample counts are not read,
            // but the library needs to allocate memory for them internally
            // - bufferSize is how much memory this function will allocate
            // - fileBufferSize tracks how much decompressed data the library will require
            //
            size_t bufferSize = 0;
            size_t fileBufferSize = 0;
            for (uint64_t j = 0; j < w; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    fileBufferSize += localSampleCount[j];
                    //
                    // don't read samples which require a lot of memory in reduceMemory mode
                    //

                    if (!reduceMemory || localSampleCount[j] * bytesPerSample <=
                                             gMaxBytesPerDeepPixel)
                    {
                        bufferSize += localSampleCount[j];
                    }
                }
            }

            //
            // limit total number of samples read in reduceMemory mode
            //
            if (!reduceMemory || fileBufferSize + bufferSize < gMaxBytesPerDeepScanline)
            {
                //
                // allocate sample buffer and set per-pixel pointers into buffer
                //
                pixelBuffer.resize (bufferSize);

                size_t bufferIndex = 0;
                for (uint64_t j = 0; j < w; j++)
                {
                    for (int k = 0; k < channelCount; k++)
                    {

                        if (localSampleCount[j] == 0 ||
                            (reduceMemory &&
                             localSampleCount[j] * bytesPerSample >
                                 gMaxBytesPerDeepPixel))
                        {
                            data[k][j] = nullptr;
                        }
                        else
                        {
                            data[k][j] = &pixelBuffer[bufferIndex];
                            bufferIndex += localSampleCount[j];
                        }
                    }
                }

                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;
                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}